

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O2

void __thiscall CppMLNN::run_train(CppMLNN *this,MatrixXd *train_examples,VectorXd *train_labels)

{
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  ulong startCol;
  double dVar4;
  pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  input_data;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  A;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  gradients;
  Matrix<double,__1,__1,_0,__1,__1> examples;
  value_type y_p;
  Matrix<double,__1,__1,_0,__1,__1> labels;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  Z;
  random_device rd;
  pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  pStack_14d8;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_14a8;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1488;
  DenseStorage<double,__1,__1,__1,_0> local_1470;
  vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_1458;
  DenseStorage<double,__1,__1,__1,_0> local_1440;
  DenseStorage<double,__1,__1,__1,_0> local_1428;
  MatrixXd local_1410;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_13f8;
  random_device local_13b8;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"run_train");
  std::endl<char,std::char_traits<char>>(poVar2);
  preprocess_data(&pStack_14d8,this,train_examples,train_labels);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_1470,(DenseStorage<double,__1,__1,__1,_0> *)&pStack_14d8);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_1428,(DenseStorage<double,__1,__1,__1,_0> *)&pStack_14d8.second);
  this->m_examples =
       pStack_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_cols;
  this->m_input_size =
       pStack_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_rows;
  poVar2 = std::operator<<((ostream *)&std::cout,"run_train");
  poVar2 = std::operator<<(poVar2,":: ");
  poVar2 = std::operator<<(poVar2,"start training...");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::random_device::random_device(&local_13b8);
  while (((0 < this->m_epoch_max && (this->m_epoch < this->m_epoch_max)) &&
         (this->m_minimum_loss <= this->m_loss))) {
    local_1488.
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1488.
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1488.
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (this->m_sgd_enabled == true) {
      uVar1 = std::random_device::_M_getval();
      startCol = (ulong)uVar1 %
                 (pStack_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_storage.m_cols - this->m_mini_batch_size);
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_13f8,&pStack_14d8.first,0,startCol,
                 pStack_14d8.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows,this->m_mini_batch_size);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_1470,&local_13f8);
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_13f8,&pStack_14d8.second,0,startCol,
                 pStack_14d8.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_storage.m_rows,this->m_mini_batch_size);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_1428,&local_13f8);
    }
    local_13f8.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
    m_data = (PointerType)0x0;
    local_13f8.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
    m_rows.m_value = 0;
    local_13f8.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
    m_cols.m_value = 0;
    local_14a8.
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_14a8.
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_14a8.
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1458.
    super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1458.
    super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1458.
    super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    forward_propagation(this,(MatrixXd *)&local_1470,
                        (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         *)&local_13f8,&local_14a8,&local_1458);
    std::
    vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
    ::~vector(&local_1458);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_1440,
               (DenseStorage<double,__1,__1,__1,_0> *)
               (local_14a8.
                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    back_propagation(&local_1410,this,
                     (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)&local_13f8,&local_14a8,(MatrixXd *)&local_1428,&local_1488);
    free(local_1410.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    lVar3 = this->m_epoch_batch + 1;
    this->m_epoch_batch = lVar3;
    if ((lVar3 * this->m_mini_batch_size) % this->m_examples == 0) {
      this->m_epoch = this->m_epoch + 1;
      dVar4 = loss(this,(MatrixXd *)&local_1440,(MatrixXd *)&local_1428);
      this->m_loss = dVar4;
      if (this->m_learn_rate_decay_enabled == true) {
        decay_learn_rate(this);
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"run_train");
      poVar2 = std::operator<<(poVar2,":: ");
      poVar2 = std::operator<<(poVar2,"epoch: ");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2,"/");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      std::operator<<(poVar2,", loss: ");
      poVar2 = std::ostream::_M_insert<double>(this->m_loss);
      std::operator<<(poVar2,"; ");
      std::operator<<((ostream *)&std::cout,"learning rate: ");
      poVar2 = std::ostream::_M_insert<double>(this->m_learn_rate);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"run_train");
    poVar2 = std::operator<<(poVar2,":: ");
    poVar2 = std::operator<<(poVar2,"epoch: ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2,"/");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2,", loss: ");
    poVar2 = std::ostream::_M_insert<double>(this->m_loss);
    std::endl<char,std::char_traits<char>>(poVar2);
    free(local_1440.m_data);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&local_14a8);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)&local_13f8);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&local_1488);
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<(poVar2,"run_train");
  poVar2 = std::operator<<(poVar2,":: ");
  poVar2 = std::operator<<(poVar2,"finish training model!");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::random_device::~random_device(&local_13b8);
  free(local_1428.m_data);
  free(local_1470.m_data);
  std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
  ~pair(&pStack_14d8);
  return;
}

Assistant:

void CppMLNN::run_train(const MatrixXd &train_examples, const VectorXd &train_labels) {
	cout << __FUNCTION__ << endl;

	auto input_data = preprocess_data(train_examples, train_labels);
	const auto& all_examples = input_data.first;
	const auto& all_labels = input_data.second;
	auto examples = all_examples;
	auto labels = all_labels;

	m_examples = all_examples.cols();
	m_input_size = all_examples.rows();

	//check_gradient(examples, labels);
    
	cout << __FUNCTION__ << ":: " << "start training..." << endl;

    // loop to minimize loss function.
	random_device rd;
    while ((m_epoch_max > 0 && m_epoch < m_epoch_max) && m_loss >= m_minimum_loss) {
		vector<MatrixXd> gradients;

		if (m_sgd_enabled) {
			// perform mini-batch.
			auto rand_sample = rd() % (all_examples.cols() - m_mini_batch_size);
			examples = all_examples.block(0, rand_sample, all_examples.rows(), m_mini_batch_size);
			labels = all_labels.block(0, rand_sample, all_labels.rows(), m_mini_batch_size);
		}

		vector<MatrixXd> Z, A;
		forward_propagation(examples, Z, A);
		auto y_p = A.back();
		back_propagation(Z, A, labels, gradients);

		m_epoch_batch++;
		if ((m_epoch_batch * m_mini_batch_size) % m_examples == 0) {
			m_epoch++;

			m_loss = loss(y_p, labels);

			if (m_learn_rate_decay_enabled) decay_learn_rate();

			cout << __FUNCTION__ << ":: " << "epoch: " << m_epoch << "/" << m_epoch_max
				<< ", loss: " << m_loss << "; ";
			cout << "learning rate: " << m_learn_rate << endl;
		}

		cout << __FUNCTION__ << ":: " << "epoch: " << m_epoch << "/" << m_epoch_max
			<< ", loss: " << m_loss << endl;
    }

    cout << endl << __FUNCTION__ << ":: " << "finish training model!" << endl;
}